

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUVJobServerClient.cxx
# Opt level: O0

void __thiscall anon_unknown.dwarf_35d814::ImplPosix::Disconnect(ImplPosix *this,int status)

{
  int status_local;
  ImplPosix *this_local;
  
  if (this->Conn != None) {
    (*(this->super_Impl)._vptr_Impl[4])();
    if (this->Conn == FDs) {
      ::cm::uv_handle_ptr_base_<uv_pipe_s>::reset((uv_handle_ptr_base_<uv_pipe_s> *)&this->ConnRead)
      ;
      ::cm::uv_handle_ptr_base_<uv_pipe_s>::reset
                ((uv_handle_ptr_base_<uv_pipe_s> *)&this->ConnWrite);
    }
    else if (this->Conn == FIFO) {
      ::cm::uv_handle_ptr_base_<uv_pipe_s>::reset((uv_handle_ptr_base_<uv_pipe_s> *)&this->ConnFIFO)
      ;
    }
    this->Conn = None;
    if (status != 0) {
      cmUVJobServerClient::Impl::Disconnected(&this->super_Impl,status);
    }
  }
  return;
}

Assistant:

void ImplPosix::Disconnect(int status)
{
  if (this->Conn == Connection::None) {
    return;
  }

  this->StopReceivingTokens();

  switch (this->Conn) {
    case Connection::FDs:
      this->ConnRead.reset();
      this->ConnWrite.reset();
      break;
    case Connection::FIFO:
      this->ConnFIFO.reset();
      break;
    default:
      break;
  }

  this->Conn = Connection::None;
  if (status != 0) {
    this->Disconnected(status);
  }
}